

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *__format;
  
  iVar1 = test_sem();
  if (iVar1 == 0) {
    iVar1 = test_shm();
    if (iVar1 == 0) {
      iVar1 = mq_test_all();
      if (iVar1 == 0) {
        iVar1 = test_qsys();
        if (iVar1 == 0) {
          iVar1 = test_psist_file();
          if (iVar1 == 0) {
            iVar1 = test_net();
            if (iVar1 == 0) {
              iVar1 = test_log();
              if (iVar1 == 0) {
                puts("all test succeed!");
                exit(0);
              }
              __format = "log test failed.";
            }
            else {
              __format = "net test failed.";
            }
          }
          else {
            __format = "psist test failed.";
          }
        }
        else {
          __format = "qsys test failed.";
        }
      }
      else {
        __format = "mq test failed.";
      }
    }
    else {
      __format = "shm test failed.";
    }
  }
  else {
    __format = "sem test failed.";
  }
  printf(__format);
  exit(-1);
}

Assistant:

int main(int argc, char **argv)
{
	int ret;

	ret = test_sem();
	if (0 != ret) {
		printf("sem test failed.");
		exit(-1);
	}
	
	ret = test_shm();
	if (0 != ret) {
		printf("shm test failed.");
		exit(-1);
	}

	ret = mq_test_all();
	if (0 != ret) {
		printf("mq test failed.");
		exit(-1);
	}


	ret = test_qsys();
	if (0 != ret) {
		printf("qsys test failed.");
		exit(-1);
	}


	ret = test_psist_file();
	if (0 != ret) {
		printf("psist test failed.");
		exit(-1);
	}


	ret = test_net();
	if (0 != ret){
		printf("net test failed.");
		exit(-1);
	}


	if(ENABLE_LOG_TEST)
	{
		ret = test_log();
		if (0 != ret){
			printf("log test failed.");
			exit(-1);
		}
	}

	printf("all test succeed!\n");
	exit(0);
}